

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O0

void __thiscall NPC::Killed(NPC *this,Character *from,int amount,int spell_id)

{
  byte bVar1;
  World *pWVar2;
  Party *this_00;
  Character *pCVar3;
  _List_node_base *p_Var4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  mapped_type *pmVar9;
  NPC_Data *pNVar10;
  pointer pNVar11;
  size_type sVar12;
  reference ppNVar13;
  reference puVar14;
  int *piVar15;
  __shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar16;
  list<Character_*,_std::allocator<Character_*>_> *plVar17;
  reference puVar18;
  reference pvVar19;
  reference ppPVar20;
  pointer pNVar21;
  ENF_Data *pEVar22;
  vector<NPC_*,_std::allocator<NPC_*>_> *pvVar23;
  reference ppNVar24;
  reference ppCVar25;
  map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
  *this_02;
  reference ppVar26;
  element_type *peVar27;
  Quest *this_03;
  ulong uVar28;
  PacketFamily PVar29;
  double dVar30;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  undefined1 auVar31 [16];
  pair<std::_Rb_tree_const_iterator<Party_*>,_bool> pVar32;
  bool local_863;
  bool local_862;
  Direction local_861;
  int local_85c;
  bool local_762;
  undefined1 local_5b8 [8];
  pair<const_short,_std::shared_ptr<Quest_Context>_> q;
  iterator __end1_3;
  iterator __begin1_3;
  map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
  *__range1_3;
  __normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_> local_580;
  const_iterator local_578;
  NPC *local_570;
  NPC **local_568;
  __normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_> local_560;
  __normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_> local_558;
  const_iterator local_550;
  Character *local_548;
  Character *character_1;
  iterator __end2_4;
  iterator __begin2_4;
  list<Character_*,_std::allocator<Character_*>_> *__range2_4;
  PacketBuilder builder_1;
  NPC *npc_1;
  iterator __end2_3;
  iterator __begin2_3;
  vector<NPC_*,_std::allocator<NPC_*>_> *__range2_3;
  NPC *npc;
  iterator __end2_2;
  iterator __begin2_2;
  vector<NPC_*,_std::allocator<NPC_*>_> *__range2_2;
  vector<NPC_*,_std::allocator<NPC_*>_> child_npcs;
  short childid;
  iterator local_490;
  const_iterator local_488;
  NPC *local_480;
  _List_node_base *local_478;
  _List_iterator<NPC_*> local_470;
  iterator local_468;
  const_iterator local_460;
  unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *local_458;
  unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *opponent_3;
  iterator __end1_2;
  iterator __begin1_2;
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  *__range1_2;
  Party *party;
  iterator __end1_1;
  iterator __begin1_1;
  set<Party_*,_std::less<Party_*>,_std::allocator<Party_*>_> *__range1_1;
  allocator<char> local_409;
  key_type local_408;
  allocator<char> local_3e1;
  key_type local_3e0;
  allocator<char> local_3b9;
  key_type local_3b8;
  allocator<char> local_391;
  key_type local_390;
  int local_36c;
  _Base_ptr local_368;
  undefined1 local_360;
  int local_354;
  iterator iStack_350;
  int reward;
  undefined1 local_348 [8];
  PacketBuilder builder;
  iterator iStack_310;
  bool level_up;
  _Self local_308;
  _Self local_300;
  iterator findopp;
  Character *character;
  iterator __end1;
  iterator __begin1;
  list<Character_*,_std::allocator<Character_*>_> *__range1;
  unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *opponent_2;
  iterator __end3_2;
  iterator __begin3_2;
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  *__range3_2;
  int i;
  int rand;
  unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *opponent_1;
  iterator __end3_1;
  iterator __begin3_1;
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  *__range3_1;
  int count_hp;
  int rewarded_hp;
  double local_260;
  int local_254;
  undefined1 local_250 [8];
  shared_ptr<Map_Item> newitem;
  key_type local_238;
  int local_218;
  int local_214;
  Character *local_210;
  Character *drop_winner;
  uint local_200;
  int dropamount;
  int dropid;
  int dropuid;
  unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *opponent;
  iterator __end2_1;
  iterator __begin2_1;
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  *__range2_1;
  unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_> *checkdrop_2;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
  *__range4;
  double roll;
  unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_> *checkdrop_1;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
  *__range3;
  unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_> *local_188;
  unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_> *checkdrop;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
  *__range2;
  vector<NPC_Drop_*,_std::allocator<NPC_Drop_*>_> drops;
  NPC_Drop *drop;
  Character *most_damage;
  undefined1 local_138 [4];
  int most_damage_counter;
  set<Party_*,_std::less<Party_*>,_std::allocator<Party_*>_> parties;
  key_type local_100;
  int local_e0;
  allocator<char> local_d9;
  int dropratemode;
  int local_b8;
  allocator<char> local_b1;
  int partysharemode;
  int local_90;
  allocator<char> local_89;
  int sharemode;
  double local_68;
  double exprate;
  allocator<char> local_49;
  key_type local_48;
  double local_28;
  double droprate;
  int spell_id_local;
  int amount_local;
  Character *from_local;
  NPC *this_local;
  
  pWVar2 = this->map->world;
  droprate._0_4_ = spell_id;
  droprate._4_4_ = amount;
  _spell_id_local = from;
  from_local = (Character *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"DropRate",&local_49);
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar2->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_48);
  dVar30 = util::variant::operator_cast_to_double(pmVar9);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pWVar2 = this->map->world;
  local_28 = dVar30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&sharemode,"ExpRate",&local_89);
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar2->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,(key_type *)&sharemode);
  dVar30 = util::variant::operator_cast_to_double(pmVar9);
  std::__cxx11::string::~string((string *)&sharemode);
  std::allocator<char>::~allocator(&local_89);
  pWVar2 = this->map->world;
  local_68 = dVar30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&partysharemode,"ShareMode",&local_b1);
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar2->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,(key_type *)&partysharemode);
  iVar7 = util::variant::operator_cast_to_int(pmVar9);
  std::__cxx11::string::~string((string *)&partysharemode);
  std::allocator<char>::~allocator(&local_b1);
  pWVar2 = this->map->world;
  local_90 = iVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dropratemode,"PartyShareMode",&local_d9);
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar2->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,(key_type *)&dropratemode);
  iVar7 = util::variant::operator_cast_to_int(pmVar9);
  std::__cxx11::string::~string((string *)&dropratemode);
  std::allocator<char>::~allocator(&local_d9);
  pWVar2 = this->map->world;
  local_b8 = iVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"DropRateMode",
             (allocator<char> *)
             ((long)&parties._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  pmVar9 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar2->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_100);
  iVar7 = util::variant::operator_cast_to_int(pmVar9);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&parties._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  local_e0 = iVar7;
  std::set<Party_*,_std::less<Party_*>,_std::allocator<Party_*>_>::set
            ((set<Party_*,_std::less<Party_*>,_std::allocator<Party_*>_> *)local_138);
  most_damage._4_4_ = 0;
  drop = (NPC_Drop *)0x0;
  drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->alive = false;
  dVar30 = Timer::GetTime();
  this->dead_since = (double)(int)dVar30;
  if (local_e0 == 1) {
    std::vector<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>::vector
              ((vector<NPC_Drop_*,_std::allocator<NPC_Drop_*>_> *)&__range2);
    pNVar10 = Data(this);
    __end2 = std::
             vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
             ::begin(&pNVar10->drops);
    checkdrop = (unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_> *)
                std::
                vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
                ::end(&pNVar10->drops);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_*,_std::vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>_>
                                       *)&checkdrop), bVar5) {
      local_188 = __gnu_cxx::
                  __normal_iterator<const_std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_*,_std::vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>_>
                  ::operator*(&__end2);
      util::rand();
      pNVar11 = std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>::operator->(local_188);
      if (extraout_XMM0_Qa <= pNVar11->chance * local_28) {
        __range3 = (vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
                    *)std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>::get(local_188);
        std::vector<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>::push_back
                  ((vector<NPC_Drop_*,_std::allocator<NPC_Drop_*>_> *)&__range2,
                   (value_type *)&__range3);
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_*,_std::vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>_>
      ::operator++(&__end2);
    }
    sVar12 = std::vector<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>::size
                       ((vector<NPC_Drop_*,_std::allocator<NPC_Drop_*>_> *)&__range2);
    if (sVar12 != 0) {
      std::vector<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>::size
                ((vector<NPC_Drop_*,_std::allocator<NPC_Drop_*>_> *)&__range2);
      iVar7 = util::rand();
      ppNVar13 = std::vector<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>::operator[]
                           ((vector<NPC_Drop_*,_std::allocator<NPC_Drop_*>_> *)&__range2,(long)iVar7
                           );
      drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*ppNVar13;
    }
    std::vector<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>::~vector
              ((vector<NPC_Drop_*,_std::allocator<NPC_Drop_*>_> *)&__range2);
  }
  else if (local_e0 == 2) {
    pNVar10 = Data(this);
    __end3 = std::
             vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
             ::begin(&pNVar10->drops);
    checkdrop_1 = (unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_> *)
                  std::
                  vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
                  ::end(&pNVar10->drops);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_*,_std::vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>_>
                                       *)&checkdrop_1), bVar5) {
      puVar14 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_*,_std::vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>_>
                ::operator*(&__end3);
      util::rand();
      pNVar11 = std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>::operator->(puVar14);
      if (extraout_XMM0_Qa_00 <= pNVar11->chance * local_28) {
        drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>::get(puVar14);
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_*,_std::vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>_>
      ::operator++(&__end3);
    }
  }
  else if (local_e0 == 3) {
    Data(this);
    util::rand();
    pNVar10 = Data(this);
    __end4 = std::
             vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
             ::begin(&pNVar10->drops);
    checkdrop_2 = (unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_> *)
                  std::
                  vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
                  ::end(&pNVar10->drops);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<const_std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_*,_std::vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>_>
                                       *)&checkdrop_2), bVar5) {
      puVar14 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_*,_std::vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>_>
                ::operator*(&__end4);
      pNVar11 = std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>::operator->(puVar14);
      if (pNVar11->chance_offset <= extraout_XMM0_Qa_01) {
        pNVar11 = std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>::operator->(puVar14);
        dVar30 = pNVar11->chance_offset;
        pNVar11 = std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>::operator->(puVar14);
        if (extraout_XMM0_Qa_01 < dVar30 + pNVar11->chance) {
          drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>::get(puVar14);
          break;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_*,_std::vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>_>
      ::operator++(&__end4);
    }
  }
  if (local_90 == 1) {
    __end2_1 = std::__cxx11::
               list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
               ::begin(&this->damagelist);
    opponent = (unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *)
               std::__cxx11::
               list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
               ::end(&this->damagelist);
    while (bVar5 = std::operator!=(&__end2_1,(_Self *)&opponent), bVar5) {
      _dropid = std::
                _List_iterator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>::
                operator*(&__end2_1);
      pNVar21 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                          (_dropid);
      if (most_damage._4_4_ < pNVar21->damage) {
        pNVar21 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                            (_dropid);
        most_damage._4_4_ = pNVar21->damage;
        pNVar21 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                            (_dropid);
        drop = (NPC_Drop *)pNVar21->attacker;
      }
      std::_List_iterator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>::
      operator++(&__end2_1);
    }
  }
  dropamount = 0;
  local_200 = 0;
  drop_winner._4_4_ = 0;
  local_210 = (Character *)0x0;
  if (drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    local_200 = (uint)*(ushort *)
                       drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
    local_214 = util::rand();
    pWVar2 = this->map->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"MaxItem",
               (allocator<char> *)
               ((long)&newitem.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi + 7));
    pmVar9 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(pWVar2->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,&local_238);
    local_218 = util::variant::operator_cast_to_int(pmVar9);
    piVar15 = std::min<int>(&local_214,&local_218);
    drop_winner._4_4_ = *piVar15;
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&newitem.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi + 7));
    if (((0 < (int)local_200) &&
        (uVar28 = (ulong)(int)local_200,
        sVar12 = std::vector<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>::size
                           (&this->map->world->eif->data), uVar28 < sVar12)) &&
       (0 < drop_winner._4_4_)) {
      dropamount = Map::GenerateItemID(this->map);
      local_254 = Character::PlayerID(_spell_id_local);
      dVar30 = Timer::GetTime();
      pWVar2 = this->map->world;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rewarded_hp,"ProtectNPCDrop",(allocator<char> *)((long)&count_hp + 3));
      pmVar9 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
               ::operator[](&(pWVar2->config).
                             super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                            ,(key_type *)&rewarded_hp);
      iVar7 = util::variant::operator_cast_to_int(pmVar9);
      local_260 = dVar30 + (double)iVar7;
      std::make_shared<Map_Item,int&,int&,int&,unsigned_char&,unsigned_char&,int,double>
                ((int *)local_250,&dropamount,(int *)&local_200,(uchar *)((long)&drop_winner + 4),
                 &this->x,(int *)&this->y,(double *)&local_254);
      std::__cxx11::string::~string((string *)&rewarded_hp);
      std::allocator<char>::~allocator((allocator<char> *)((long)&count_hp + 3));
      std::__cxx11::list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::
      push_back(&this->map->items,(value_type *)local_250);
      switch(local_90) {
      case 0:
        local_210 = _spell_id_local;
        break;
      case 1:
        local_210 = (Character *)drop;
        break;
      case 2:
        iVar7 = util::rand();
        __range3_1._4_4_ = 0;
        __end3_1 = std::__cxx11::
                   list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                   ::begin(&this->damagelist);
        opponent_1 = (unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *)
                     std::__cxx11::
                     list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                     ::end(&this->damagelist);
        while (bVar5 = std::operator!=(&__end3_1,(_Self *)&opponent_1), bVar5) {
          puVar18 = std::
                    _List_iterator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>
                    ::operator*(&__end3_1);
          pNVar21 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                              (puVar18);
          bVar5 = Character::InRange(pNVar21->attacker,this);
          if (bVar5) {
            if ((__range3_1._4_4_ <= iVar7) &&
               (pNVar21 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::
                          operator->(puVar18), iVar7 < pNVar21->damage)) {
              pNVar21 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::
                        operator->(puVar18);
              local_210 = pNVar21->attacker;
              break;
            }
            pNVar21 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                                (puVar18);
            __range3_1._4_4_ = pNVar21->damage + __range3_1._4_4_;
          }
          std::_List_iterator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>::
          operator++(&__end3_1);
        }
        break;
      case 3:
        std::__cxx11::
        list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
        ::size(&this->damagelist);
        iVar7 = util::rand();
        __range3_2._0_4_ = 0;
        __end3_2 = std::__cxx11::
                   list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                   ::begin(&this->damagelist);
        opponent_2 = (unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *)
                     std::__cxx11::
                     list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                     ::end(&this->damagelist);
        while (bVar5 = std::operator!=(&__end3_2,(_Self *)&opponent_2), bVar5) {
          puVar18 = std::
                    _List_iterator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>
                    ::operator*(&__end3_2);
          pNVar21 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                              (puVar18);
          bVar5 = Character::InRange(pNVar21->attacker,this);
          if ((bVar5) &&
             (bVar5 = iVar7 == (int)__range3_2, __range3_2._0_4_ = (int)__range3_2 + 1, bVar5)) {
            pNVar21 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                                (puVar18);
            local_210 = pNVar21->attacker;
            break;
          }
          std::_List_iterator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>::
          operator++(&__end3_2);
        }
      }
      std::shared_ptr<Map_Item>::~shared_ptr((shared_ptr<Map_Item> *)local_250);
    }
  }
  if (local_210 != (Character *)0x0) {
    uVar8 = Character::PlayerID(local_210);
    this_01 = (__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::__cxx11::
              list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::back
                        (&this->map->items);
    peVar16 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this_01);
    peVar16->owner = uVar8;
  }
  plVar17 = &this->map->characters;
  __end1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(plVar17);
  character = (Character *)
              std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(plVar17);
  while (bVar5 = std::operator!=(&__end1,(_Self *)&character), bVar5) {
    ppCVar25 = std::_List_iterator<Character_*>::operator*(&__end1);
    findopp._M_node = (_List_node_base *)*ppCVar25;
    local_300._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
         ::begin(&this->damagelist);
    while( true ) {
      local_308._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
           ::end(&this->damagelist);
      bVar6 = std::operator!=(&local_300,&local_308);
      bVar5 = false;
      if (bVar6) {
        puVar18 = std::
                  _List_iterator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>
                  ::operator*(&local_300);
        pNVar21 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                            (puVar18);
        bVar5 = pNVar21->attacker != (Character *)findopp._M_node;
      }
      if (!bVar5) break;
      std::_List_iterator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>::
      operator++(&local_300);
    }
    iStack_310 = std::__cxx11::
                 list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                 ::end(&this->damagelist);
    bVar5 = std::operator!=(&local_300,&stack0xfffffffffffffcf0);
    local_762 = true;
    if (!bVar5) {
      local_762 = Character::InRange((Character *)findopp._M_node,this);
    }
    if (local_762 != false) {
      builder.add_size._7_1_ = 0;
      PVar29 = PACKET_CAST;
      if (droprate._0_4_ == -1) {
        PVar29 = PACKET_NPC;
      }
      PacketBuilder::PacketBuilder((PacketBuilder *)local_348,PVar29,PACKET_SPEC,0x1a);
      pEVar22 = ENF(this);
      if (pEVar22->exp != 0) {
        iStack_350 = std::__cxx11::
                     list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                     ::end(&this->damagelist);
        bVar5 = std::operator!=(&local_300,&stack0xfffffffffffffcb0);
        if (bVar5) {
          switch(local_90) {
          case 0:
            if ((Character *)findopp._M_node == _spell_id_local) {
              pEVar22 = ENF(this);
              dVar30 = ceil((double)pEVar22->exp * local_68);
              local_354 = (int)dVar30;
              if (0 < local_354) {
                if (local_b8 == 0) {
                  *(int *)((long)&findopp._M_node[0xc]._M_next + 4) =
                       local_354 + *(int *)((long)&findopp._M_node[0xc]._M_next + 4);
                }
                else if (findopp._M_node[0x46]._M_prev == (_List_node_base *)0x0) {
                  *(int *)((long)&findopp._M_node[0xc]._M_next + 4) =
                       local_354 + *(int *)((long)&findopp._M_node[0xc]._M_next + 4);
                }
                else {
                  Party::ShareEXP((Party *)findopp._M_node[0x46]._M_prev,local_354,local_b8,
                                  this->map);
                }
              }
            }
            break;
          case 1:
            if ((NPC_Drop *)findopp._M_node == drop) {
              pEVar22 = ENF(this);
              dVar30 = ceil((double)pEVar22->exp * local_68);
              local_354 = (int)dVar30;
              if (0 < local_354) {
                if (local_b8 == 0) {
                  *(int *)((long)&findopp._M_node[0xc]._M_next + 4) =
                       local_354 + *(int *)((long)&findopp._M_node[0xc]._M_next + 4);
                }
                else if (findopp._M_node[0x46]._M_prev == (_List_node_base *)0x0) {
                  *(int *)((long)&findopp._M_node[0xc]._M_next + 4) =
                       local_354 + *(int *)((long)&findopp._M_node[0xc]._M_next + 4);
                }
                else {
                  Party::ShareEXP((Party *)findopp._M_node[0x46]._M_prev,local_354,local_b8,
                                  this->map);
                }
              }
            }
            break;
          case 2:
            pEVar22 = ENF(this);
            dVar30 = (double)pEVar22->exp * local_68;
            puVar18 = std::
                      _List_iterator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>
                      ::operator*(&local_300);
            pNVar21 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                                (puVar18);
            dVar30 = ceil(dVar30 * ((double)pNVar21->damage / (double)this->totaldamage));
            local_354 = (int)dVar30;
            if (0 < local_354) {
              if (local_b8 == 0) {
                *(int *)((long)&findopp._M_node[0xc]._M_next + 4) =
                     local_354 + *(int *)((long)&findopp._M_node[0xc]._M_next + 4);
              }
              else if (findopp._M_node[0x46]._M_prev == (_List_node_base *)0x0) {
                *(int *)((long)&findopp._M_node[0xc]._M_next + 4) =
                     local_354 + *(int *)((long)&findopp._M_node[0xc]._M_next + 4);
              }
              else {
                *(int *)&findopp._M_node[0x46]._M_prev[2]._M_prev =
                     *(int *)&findopp._M_node[0x46]._M_prev[2]._M_prev + local_354;
                pVar32 = std::set<Party_*,_std::less<Party_*>,_std::allocator<Party_*>_>::insert
                                   ((set<Party_*,_std::less<Party_*>,_std::allocator<Party_*>_> *)
                                    local_138,(value_type *)&findopp._M_node[0x46]._M_prev);
                local_368 = (_Base_ptr)pVar32.first._M_node;
                local_360 = pVar32.second;
              }
            }
            break;
          case 3:
            pEVar22 = ENF(this);
            dVar30 = (double)pEVar22->exp * local_68;
            sVar12 = std::__cxx11::
                     list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                     ::size(&this->damagelist);
            auVar31._8_4_ = (int)(sVar12 >> 0x20);
            auVar31._0_8_ = sVar12;
            auVar31._12_4_ = 0x45300000;
            dVar30 = ceil(dVar30 * (((auVar31._8_8_ - 1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)sVar12) - 4503599627370496.0))
                                   / 1.0));
            local_354 = (int)dVar30;
            if (0 < local_354) {
              if (local_b8 == 0) {
                *(int *)((long)&findopp._M_node[0xc]._M_next + 4) =
                     local_354 + *(int *)((long)&findopp._M_node[0xc]._M_next + 4);
              }
              else if (findopp._M_node[0x46]._M_prev == (_List_node_base *)0x0) {
                *(int *)((long)&findopp._M_node[0xc]._M_next + 4) =
                     local_354 + *(int *)((long)&findopp._M_node[0xc]._M_next + 4);
              }
              else {
                *(int *)&findopp._M_node[0x46]._M_prev[2]._M_prev =
                     local_354 + *(int *)&findopp._M_node[0x46]._M_prev[2]._M_prev;
              }
            }
          }
          p_Var4 = findopp._M_node + 0xc;
          pWVar2 = this->map->world;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_390,"MaxExp",&local_391);
          pmVar9 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                   ::operator[](&(pWVar2->config).
                                 super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                ,&local_390);
          local_36c = util::variant::operator_cast_to_int(pmVar9);
          piVar15 = std::min<int>((int *)((long)&p_Var4->_M_next + 4),&local_36c);
          *(int *)((long)&findopp._M_node[0xc]._M_next + 4) = *piVar15;
          std::__cxx11::string::~string((string *)&local_390);
          std::allocator<char>::~allocator(&local_391);
          while( true ) {
            bVar1 = *(byte *)((long)&findopp._M_node[0xc]._M_next + 3);
            pWVar2 = this->map->world;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3b8,"MaxLevel",&local_3b9);
            pmVar9 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                     ::operator[](&(pWVar2->config).
                                   super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                  ,&local_3b8);
            iVar7 = util::variant::operator_cast_to_int(pmVar9);
            bVar5 = false;
            if ((int)(uint)bVar1 < iVar7) {
              iVar7 = *(int *)((long)&findopp._M_node[0xc]._M_next + 4);
              pvVar19 = std::array<int,_254UL>::operator[]
                                  (&this->map->world->exp_table,
                                   (long)(int)(*(byte *)((long)&findopp._M_node[0xc]._M_next + 3) +
                                              1));
              bVar5 = *pvVar19 <= iVar7;
            }
            std::__cxx11::string::~string((string *)&local_3b8);
            std::allocator<char>::~allocator(&local_3b9);
            if (!bVar5) break;
            builder.add_size._7_1_ = 1;
            *(char *)((long)&findopp._M_node[0xc]._M_next + 3) =
                 *(char *)((long)&findopp._M_node[0xc]._M_next + 3) + '\x01';
            pWVar2 = this->map->world;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3e0,"StatPerLevel",&local_3e1);
            pmVar9 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                     ::operator[](&(pWVar2->config).
                                   super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                  ,&local_3e0);
            iVar7 = util::variant::operator_cast_to_int(pmVar9);
            *(int *)&findopp._M_node[0x10]._M_next = *(int *)&findopp._M_node[0x10]._M_next + iVar7;
            std::__cxx11::string::~string((string *)&local_3e0);
            std::allocator<char>::~allocator(&local_3e1);
            pWVar2 = this->map->world;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_408,"SkillPerLevel",&local_409);
            pmVar9 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                     ::operator[](&(pWVar2->config).
                                   super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                  ,&local_408);
            iVar7 = util::variant::operator_cast_to_int(pmVar9);
            *(int *)((long)&findopp._M_node[0x10]._M_next + 4) =
                 *(int *)((long)&findopp._M_node[0x10]._M_next + 4) + iVar7;
            std::__cxx11::string::~string((string *)&local_408);
            std::allocator<char>::~allocator(&local_409);
            Character::CalculateStats((Character *)findopp._M_node,true);
          }
          if ((builder.add_size._7_1_ & 1) != 0) {
            PVar29 = PACKET_CAST;
            if (droprate._0_4_ == -1) {
              PVar29 = PACKET_NPC;
            }
            PacketBuilder::SetID((PacketBuilder *)local_348,PVar29,PACKET_ACCEPT);
            PacketBuilder::ReserveMore((PacketBuilder *)local_348,0x21);
          }
        }
      }
      if (droprate._0_4_ != -1) {
        PacketBuilder::AddShort((PacketBuilder *)local_348,droprate._0_4_);
      }
      if (local_210 == (Character *)0x0) {
        local_85c = Character::PlayerID(_spell_id_local);
      }
      else {
        local_85c = Character::PlayerID(local_210);
      }
      PacketBuilder::AddShort((PacketBuilder *)local_348,local_85c);
      if (local_210 == (Character *)0x0) {
        local_861 = _spell_id_local->direction;
      }
      else {
        local_861 = local_210->direction;
      }
      PacketBuilder::AddChar((PacketBuilder *)local_348,(uint)local_861);
      PacketBuilder::AddShort((PacketBuilder *)local_348,(uint)this->index);
      PacketBuilder::AddShort((PacketBuilder *)local_348,dropamount);
      PacketBuilder::AddShort((PacketBuilder *)local_348,local_200);
      PacketBuilder::AddChar((PacketBuilder *)local_348,(uint)this->x);
      PacketBuilder::AddChar((PacketBuilder *)local_348,(uint)this->y);
      PacketBuilder::AddInt((PacketBuilder *)local_348,drop_winner._4_4_);
      PacketBuilder::AddThree((PacketBuilder *)local_348,droprate._4_4_);
      if (droprate._0_4_ != -1) {
        PacketBuilder::AddShort((PacketBuilder *)local_348,_spell_id_local->tp);
      }
      if ((local_90 != 0) || (local_862 = true, (Character *)findopp._M_node != _spell_id_local)) {
        local_863 = false;
        if (local_90 != 0) {
          __range1_1 = (set<Party_*,_std::less<Party_*>,_std::allocator<Party_*>_> *)
                       std::__cxx11::
                       list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                       ::end(&this->damagelist);
          local_863 = std::operator!=(&local_300,(_Self *)&__range1_1);
        }
        local_862 = local_863;
      }
      if (local_862 != false) {
        PacketBuilder::AddInt
                  ((PacketBuilder *)local_348,*(int *)((long)&findopp._M_node[0xc]._M_next + 4));
      }
      if ((builder.add_size._7_1_ & 1) != 0) {
        PacketBuilder::AddChar
                  ((PacketBuilder *)local_348,
                   (uint)*(byte *)((long)&findopp._M_node[0xc]._M_next + 3));
        PacketBuilder::AddShort((PacketBuilder *)local_348,*(int *)&findopp._M_node[0x10]._M_next);
        PacketBuilder::AddShort
                  ((PacketBuilder *)local_348,*(int *)((long)&findopp._M_node[0x10]._M_next + 4));
        PacketBuilder::AddShort((PacketBuilder *)local_348,*(int *)&findopp._M_node[0x17]._M_next);
        PacketBuilder::AddShort
                  ((PacketBuilder *)local_348,*(int *)((long)&findopp._M_node[0x17]._M_next + 4));
        PacketBuilder::AddShort
                  ((PacketBuilder *)local_348,*(int *)((long)&findopp._M_node[0x16]._M_prev + 4));
      }
      Character::Send((Character *)findopp._M_node,(PacketBuilder *)local_348);
      PacketBuilder::~PacketBuilder((PacketBuilder *)local_348);
    }
    std::_List_iterator<Character_*>::operator++(&__end1);
  }
  __end1_1 = std::set<Party_*,_std::less<Party_*>,_std::allocator<Party_*>_>::begin
                       ((set<Party_*,_std::less<Party_*>,_std::allocator<Party_*>_> *)local_138);
  party = (Party *)std::set<Party_*,_std::less<Party_*>,_std::allocator<Party_*>_>::end
                             ((set<Party_*,_std::less<Party_*>,_std::allocator<Party_*>_> *)
                              local_138);
  while (bVar5 = std::operator!=(&__end1_1,(_Self *)&party), bVar5) {
    ppPVar20 = std::_Rb_tree_const_iterator<Party_*>::operator*(&__end1_1);
    this_00 = *ppPVar20;
    Party::ShareEXP(this_00,this_00->temp_expsum,local_b8,this->map);
    this_00->temp_expsum = 0;
    std::_Rb_tree_const_iterator<Party_*>::operator++(&__end1_1);
  }
  __end1_2 = std::__cxx11::
             list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
             ::begin(&this->damagelist);
  opponent_3 = (unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *)
               std::__cxx11::
               list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
               ::end(&this->damagelist);
  while (bVar5 = std::operator!=(&__end1_2,(_Self *)&opponent_3), bVar5) {
    local_458 = std::
                _List_iterator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>::
                operator*(&__end1_2);
    pNVar21 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                        (local_458);
    pCVar3 = pNVar21->attacker;
    pNVar21 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                        (local_458);
    local_470._M_node =
         (_List_node_base *)
         std::begin<std::__cxx11::list<NPC*,std::allocator<NPC*>>>
                   (&pNVar21->attacker->unregister_npc);
    pNVar21 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                        (local_458);
    local_478 = (_List_node_base *)
                std::end<std::__cxx11::list<NPC*,std::allocator<NPC*>>>
                          (&pNVar21->attacker->unregister_npc);
    local_480 = this;
    local_468._M_node =
         (_List_node_base *)
         std::remove<std::_List_iterator<NPC*>,NPC*>
                   (local_470,(_List_iterator<NPC_*>)local_478,&local_480);
    std::_List_const_iterator<NPC_*>::_List_const_iterator(&local_460,&local_468);
    pNVar21 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                        (local_458);
    local_490._M_node =
         (_List_node_base *)
         std::__cxx11::list<NPC_*,_std::allocator<NPC_*>_>::end(&pNVar21->attacker->unregister_npc);
    std::_List_const_iterator<NPC_*>::_List_const_iterator(&local_488,&local_490);
    std::__cxx11::list<NPC_*,_std::allocator<NPC_*>_>::erase
              (&pCVar3->unregister_npc,local_460,local_488);
    std::_List_iterator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>::
    operator++(&__end1_2);
  }
  std::__cxx11::
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  ::clear(&this->damagelist);
  this->totaldamage = 0;
  child_npcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_2_ = -1;
  pEVar22 = ENF(this);
  if (pEVar22->boss != 0) {
    std::vector<NPC_*,_std::allocator<NPC_*>_>::vector
              ((vector<NPC_*,_std::allocator<NPC_*>_> *)&__range2_2);
    pvVar23 = &this->map->npcs;
    __end2_2 = std::vector<NPC_*,_std::allocator<NPC_*>_>::begin(pvVar23);
    npc = (NPC *)std::vector<NPC_*,_std::allocator<NPC_*>_>::end(pvVar23);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                               *)&npc), bVar5) {
      ppNVar24 = __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
                 operator*(&__end2_2);
      __range2_3 = (vector<NPC_*,_std::allocator<NPC_*>_> *)*ppNVar24;
      pEVar22 = ENF((NPC *)__range2_3);
      if (((pEVar22->child != 0) && (pEVar22 = ENF((NPC *)__range2_3), pEVar22->boss == 0)) &&
         (((ulong)(__range2_3->super__Vector_base<NPC_*,_std::allocator<NPC_*>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage & 1) != 0)) {
        std::vector<NPC_*,_std::allocator<NPC_*>_>::push_back
                  ((vector<NPC_*,_std::allocator<NPC_*>_> *)&__range2_2,(value_type *)&__range2_3);
      }
      __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::operator++
                (&__end2_2);
    }
    __end2_3 = std::vector<NPC_*,_std::allocator<NPC_*>_>::begin
                         ((vector<NPC_*,_std::allocator<NPC_*>_> *)&__range2_2);
    npc_1 = (NPC *)std::vector<NPC_*,_std::allocator<NPC_*>_>::end
                             ((vector<NPC_*,_std::allocator<NPC_*>_> *)&__range2_2);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end2_3,
                              (__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                               *)&npc_1), bVar5) {
      ppNVar24 = __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
                 operator*(&__end2_3);
      builder_1.add_size = (size_t)*ppNVar24;
      if (((((NPC *)builder_1.add_size)->temporary & 1U) == 0) &&
         ((child_npcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._6_2_ == -1 ||
          ((int)child_npcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._6_2_ == ((NPC *)builder_1.add_size)->id))
         )) {
        Die((NPC *)builder_1.add_size,false);
        child_npcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage._6_2_ = (short)*(undefined4 *)(builder_1.add_size + 0x68);
      }
      else {
        Die((NPC *)builder_1.add_size,true);
      }
      __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::operator++
                (&__end2_3);
    }
    std::vector<NPC_*,_std::allocator<NPC_*>_>::~vector
              ((vector<NPC_*,_std::allocator<NPC_*>_> *)&__range2_2);
  }
  if (child_npcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._6_2_ != -1) {
    PacketBuilder::PacketBuilder((PacketBuilder *)&__range2_4,PACKET_NPC,PACKET_JUNK,2);
    PacketBuilder::AddShort
              ((PacketBuilder *)&__range2_4,
               (int)child_npcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._6_2_);
    plVar17 = &this->map->characters;
    __end2_4 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(plVar17);
    character_1 = (Character *)
                  std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(plVar17);
    while (bVar5 = std::operator!=(&__end2_4,(_Self *)&character_1), bVar5) {
      ppCVar25 = std::_List_iterator<Character_*>::operator*(&__end2_4);
      local_548 = *ppCVar25;
      Character::Send(local_548,(PacketBuilder *)&__range2_4);
      std::_List_iterator<Character_*>::operator++(&__end2_4);
    }
    PacketBuilder::~PacketBuilder((PacketBuilder *)&__range2_4);
  }
  if ((this->temporary & 1U) != 0) {
    pvVar23 = &this->map->npcs;
    local_560._M_current = (NPC **)std::vector<NPC_*,_std::allocator<NPC_*>_>::begin(pvVar23);
    local_568 = (NPC **)std::vector<NPC_*,_std::allocator<NPC_*>_>::end(&this->map->npcs);
    local_570 = this;
    local_558 = std::
                remove<__gnu_cxx::__normal_iterator<NPC**,std::vector<NPC*,std::allocator<NPC*>>>,NPC*>
                          (local_560,
                           (__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>)
                           local_568,&local_570);
    __gnu_cxx::__normal_iterator<NPC*const*,std::vector<NPC*,std::allocator<NPC*>>>::
    __normal_iterator<NPC**>
              ((__normal_iterator<NPC*const*,std::vector<NPC*,std::allocator<NPC*>>> *)&local_550,
               &local_558);
    local_580._M_current = (NPC **)std::vector<NPC_*,_std::allocator<NPC_*>_>::end(&this->map->npcs)
    ;
    __gnu_cxx::__normal_iterator<NPC*const*,std::vector<NPC*,std::allocator<NPC*>>>::
    __normal_iterator<NPC**>
              ((__normal_iterator<NPC*const*,std::vector<NPC*,std::allocator<NPC*>>> *)&local_578,
               &local_580);
    std::vector<NPC_*,_std::allocator<NPC_*>_>::erase(pvVar23,local_550,local_578);
  }
  this_02 = &_spell_id_local->quests;
  __end1_3 = std::
             map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
             ::begin(this_02);
  q.second.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
       ::end(this_02);
  while (bVar5 = std::operator!=(&__end1_3,
                                 (_Self *)&q.second.
                                           super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount), bVar5) {
    ppVar26 = std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>::
              operator*(&__end1_3);
    std::pair<const_short,_std::shared_ptr<Quest_Context>_>::pair
              ((pair<const_short,_std::shared_ptr<Quest_Context>_> *)local_5b8,ppVar26);
    bVar5 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&q);
    if (bVar5) {
      peVar27 = std::__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&q);
      this_03 = Quest_Context::GetQuest(peVar27);
      bVar5 = Quest::Disabled(this_03);
      if (!bVar5) {
        peVar27 = std::__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&q);
        pEVar22 = ENF(this);
        Quest_Context::KilledNPC(peVar27,(short)pEVar22->id);
      }
    }
    std::pair<const_short,_std::shared_ptr<Quest_Context>_>::~pair
              ((pair<const_short,_std::shared_ptr<Quest_Context>_> *)local_5b8);
    std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>::operator++
              (&__end1_3);
  }
  if (((this->temporary & 1U) != 0) && (this != (NPC *)0x0)) {
    ~NPC(this);
    operator_delete(this,0x70);
  }
  std::set<Party_*,_std::less<Party_*>,_std::allocator<Party_*>_>::~set
            ((set<Party_*,_std::less<Party_*>,_std::allocator<Party_*>_> *)local_138);
  return;
}

Assistant:

void NPC::Killed(Character *from, int amount, int spell_id)
{
	double droprate = this->map->world->config["DropRate"];
	double exprate = this->map->world->config["ExpRate"];
	int sharemode = this->map->world->config["ShareMode"];
	int partysharemode = this->map->world->config["PartyShareMode"];
	int dropratemode = this->map->world->config["DropRateMode"];
	std::set<Party *> parties;

	int most_damage_counter = 0;
	Character *most_damage = nullptr;
	NPC_Drop *drop = nullptr;

	this->alive = false;

	this->dead_since = int(Timer::GetTime());

	if (dropratemode == 1)
	{
		std::vector<NPC_Drop *> drops;

		UTIL_FOREACH_CREF(this->Data().drops, checkdrop)
		{
			if (util::rand(0.0, 100.0) <= checkdrop->chance * droprate)
			{
				drops.push_back(checkdrop.get());
			}
		}

		if (drops.size() > 0)
		{
			drop = drops[util::rand(0, drops.size()-1)];
		}
	}
	else if (dropratemode == 2)
	{
		UTIL_FOREACH_CREF(this->Data().drops, checkdrop)
		{
			if (util::rand(0.0, 100.0) <= checkdrop->chance * droprate)
			{
				drop = checkdrop.get();
				break;
			}
		}
	}
	else if (dropratemode == 3)
	{
		double roll = util::rand(0.0, this->Data().drops_chance_total);

		UTIL_FOREACH_CREF(this->Data().drops, checkdrop)
		{
			if (roll >= checkdrop->chance_offset && roll < checkdrop->chance_offset+checkdrop->chance)
			{
				drop = checkdrop.get();
				break;
			}
		}
	}

	if (sharemode == 1)
	{
		UTIL_FOREACH_CREF(this->damagelist, opponent)
		{
			if (opponent->damage > most_damage_counter)
			{
				most_damage_counter = opponent->damage;
				most_damage = opponent->attacker;
			}
		}
	}

	int dropuid = 0;
	int dropid = 0;
	int dropamount = 0;
	Character* drop_winner = nullptr;

	if (drop)
	{
		dropid = drop->id;
		dropamount = std::min<int>(util::rand(drop->min, drop->max), this->map->world->config["MaxItem"]);

		if (dropid <= 0 || static_cast<std::size_t>(dropid) >= this->map->world->eif->data.size() || dropamount <= 0)
			goto abort_drop;

		dropuid = this->map->GenerateItemID();

		std::shared_ptr<Map_Item> newitem(std::make_shared<Map_Item>(dropuid, dropid, dropamount, this->x, this->y, from->PlayerID(), Timer::GetTime() + static_cast<int>(this->map->world->config["ProtectNPCDrop"])));
		this->map->items.push_back(newitem);

		// Selects a random number between 0 and maxhp, and decides the winner based on that
		switch (sharemode)
		{
			case 0:
				drop_winner = from;
				break;

			case 1:
				drop_winner = most_damage;
				break;

			case 2:
			{
				int rewarded_hp = util::rand(0, this->totaldamage - 1);
				int count_hp = 0;
				UTIL_FOREACH_CREF(this->damagelist, opponent)
				{
					if (opponent->attacker->InRange(this))
					{
						if (rewarded_hp >= count_hp && rewarded_hp < opponent->damage)
						{
							drop_winner = opponent->attacker;
							break;
						}

						count_hp += opponent->damage;
					}
				}
			}
				break;

			case 3:
			{
				int rand = util::rand(0, this->damagelist.size() - 1);
				int i = 0;
				UTIL_FOREACH_CREF(this->damagelist, opponent)
				{
					if (opponent->attacker->InRange(this))
					{
						if (rand == i++)
						{
							drop_winner = opponent->attacker;
							break;
						}
					}
				}
			}
				break;
		}
	}
	abort_drop:

	if (drop_winner)
		this->map->items.back()->owner = drop_winner->PlayerID();

	UTIL_FOREACH(this->map->characters, character)
	{
		std::list<std::unique_ptr<NPC_Opponent>>::iterator findopp = this->damagelist.begin();
		for (; findopp != this->damagelist.end() && (*findopp)->attacker != character; ++findopp); // no loop body

		if (findopp != this->damagelist.end() || character->InRange(this))
		{
			bool level_up = false;

			PacketBuilder builder(spell_id == -1 ? PACKET_NPC : PACKET_CAST, PACKET_SPEC, 26);

			if (this->ENF().exp != 0)
			{
				if (findopp != this->damagelist.end())
				{
					int reward;
					switch (sharemode)
					{
						case 0:
							if (character == from)
							{
								reward = int(std::ceil(double(this->ENF().exp) * exprate));

								if (reward > 0)
								{
									if (partysharemode)
									{
										if (character->party)
										{
											character->party->ShareEXP(reward, partysharemode, this->map);
										}
										else
										{
											character->exp += reward;
										}
									}
									else
									{
										character->exp += reward;
									}
								}
							}
							break;

						case 1:
							if (character == most_damage)
							{
								reward = int(std::ceil(double(this->ENF().exp) * exprate));

								if (reward > 0)
								{
									if (partysharemode)
									{
										if (character->party)
										{
											character->party->ShareEXP(reward, partysharemode, this->map);
										}
										else
										{
											character->exp += reward;
										}
									}
									else
									{
										character->exp += reward;
									}
								}
							}
							break;

						case 2:
							reward = int(std::ceil(double(this->ENF().exp) * exprate * (double((*findopp)->damage) / double(this->totaldamage))));

							if (reward > 0)
							{
								if (partysharemode)
								{
									if (character->party)
									{
										character->party->temp_expsum += reward;
										parties.insert(character->party);
									}
									else
									{
										character->exp += reward;
									}
								}
								else
								{
									character->exp += reward;
								}
							}
							break;

						case 3:
							reward = int(std::ceil(double(this->ENF().exp) * exprate * (double(this->damagelist.size()) / 1.0)));

							if (reward > 0)
							{
								if (partysharemode)
								{
									if (character->party)
									{
										character->party->temp_expsum += reward;
									}
									else
									{
										character->exp += reward;
									}
								}
								else
								{
									character->exp += reward;
								}
							}
							break;
					}

					character->exp = std::min(character->exp, static_cast<int>(this->map->world->config["MaxExp"]));

					while (character->level < static_cast<int>(this->map->world->config["MaxLevel"]) && character->exp >= this->map->world->exp_table[character->level+1])
					{
						level_up = true;
						++character->level;
						character->statpoints += static_cast<int>(this->map->world->config["StatPerLevel"]);
						character->skillpoints += static_cast<int>(this->map->world->config["SkillPerLevel"]);
						character->CalculateStats();
					}

					if (level_up)
					{
						builder.SetID(spell_id == -1 ? PACKET_NPC : PACKET_CAST, PACKET_ACCEPT);
						builder.ReserveMore(33);
					}
				}
			}

			if (spell_id != -1)
				builder.AddShort(spell_id);

			builder.AddShort(drop_winner ? drop_winner->PlayerID() : from->PlayerID());
			builder.AddChar(drop_winner ? drop_winner->direction : from->direction);
			builder.AddShort(this->index);
			builder.AddShort(dropuid);
			builder.AddShort(dropid);
			builder.AddChar(this->x);
			builder.AddChar(this->y);
			builder.AddInt(dropamount);
			builder.AddThree(amount);

			if (spell_id != -1)
				builder.AddShort(from->tp);

			if ((sharemode == 0 && character == from) || (sharemode != 0 && findopp != this->damagelist.end()))
			{
				builder.AddInt(character->exp);
			}

			if (level_up)
			{
				builder.AddChar(character->level);
				builder.AddShort(character->statpoints);
				builder.AddShort(character->skillpoints);
				builder.AddShort(character->maxhp);
				builder.AddShort(character->maxtp);
				builder.AddShort(character->maxsp);
			}

			character->Send(builder);
		}
	}

	UTIL_FOREACH(parties, party)
	{
		party->ShareEXP(party->temp_expsum, partysharemode, this->map);
		party->temp_expsum = 0;
	}

	UTIL_FOREACH_CREF(this->damagelist, opponent)
	{
		opponent->attacker->unregister_npc.erase(
			std::remove(UTIL_RANGE(opponent->attacker->unregister_npc), this),
			opponent->attacker->unregister_npc.end()
		);
	}

	this->damagelist.clear();
	this->totaldamage = 0;

	short childid = -1;

	if (this->ENF().boss)
	{
		std::vector<NPC*> child_npcs;

		UTIL_FOREACH(this->map->npcs, npc)
		{
			if (npc->ENF().child && !npc->ENF().boss && npc->alive)
			{
				child_npcs.push_back(npc);
			}
		}

		UTIL_FOREACH(child_npcs, npc)
		{
			if (!npc->temporary && (childid == -1 || childid == npc->id))
			{
				npc->Die(false);
				childid = npc->id;
			}
			else
			{
				npc->Die(true);
			}
		}
	}

	if (childid != -1)
	{
		PacketBuilder builder(PACKET_NPC, PACKET_JUNK, 2);
		builder.AddShort(childid);

		UTIL_FOREACH(this->map->characters, character)
		{
			character->Send(builder);
		}
	}

	if (this->temporary)
	{
		this->map->npcs.erase(
			std::remove(this->map->npcs.begin(), this->map->npcs.end(), this),
			this->map->npcs.end()
		);
	}

	UTIL_FOREACH(from->quests, q)
	{
		if (!q.second || q.second->GetQuest()->Disabled())
			continue;

		q.second->KilledNPC(this->ENF().id);
	}

	if (this->temporary)
	{
		delete this;
		return;
	}
}